

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

bool_t DataToString(tchar_t *Value,size_t ValueLen,void *Data,size_t Size,dataflags Type)

{
  size_t sVar1;
  size_t sVar2;
  int Percent;
  ulong uVar3;
  uint p;
  int64_t p_00;
  size_t sVar4;
  int Decimal;
  uint uVar5;
  cc_fraction f;
  cc_fraction local_40;
  
  if (Size == 0) {
    Size = NodeTypeSize(Type);
  }
  uVar5 = (uint)Type;
  if ((uVar5 >> 8 & 1) != 0) {
    if ((uVar5 & 0x3f) == 4) {
      if (*Data == '\0') {
        return 0;
      }
    }
    else {
      sVar1 = 0;
      sVar4 = sVar1;
      if (Size != 0) {
        do {
          sVar4 = sVar1;
          if (*(char *)((long)Data + sVar1) != '\0') break;
          sVar1 = sVar1 + 1;
          sVar4 = Size;
        } while (Size != sVar1);
      }
      if (sVar4 == Size) {
        return 0;
      }
    }
  }
  *Value = '\0';
  switch(uVar5 & 0x3f) {
  case 1:
  case 0x18:
    p = *Data;
    goto LAB_00124ec3;
  case 2:
    p = *Data;
    local_40.Num = (int_fast32_t)(int)p;
    if ((uVar5 & 0x1f000000) == 0xf000000) {
      Data = &local_40;
      local_40.Den = 0x400;
      Percent = -1;
      Decimal = 1;
      goto LAB_00125058;
    }
    goto LAB_00124ec3;
  case 3:
    if ((uVar5 & 0x1f000000) != 0xf000000) {
      stprintf_s(Value,ValueLen,"%d:%d",*Data,*(undefined8 *)((long)Data + 8));
      return 1;
    }
    Percent = -1;
    Decimal = 2;
    goto LAB_00125058;
  case 4:
    tcscpy_s(Value,ValueLen,(tchar_t *)Data);
    break;
  case 5:
    stprintf_s(Value,ValueLen,"%d,%d,%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4),
               (ulong)*(uint *)((long)Data + 8),*(undefined4 *)((long)Data + 0xc));
    break;
  case 6:
    stprintf_s(Value,ValueLen,"%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4));
    break;
  case 7:
    RGBToString(Value,ValueLen,*Data);
    break;
  case 8:
    FourCCToString(Value,ValueLen,*Data);
    break;
  case 10:
    NodeToString(Value,ValueLen,*Data);
    break;
  case 0x10:
    if (Size != 0) {
      sVar4 = 0;
      do {
        stcatprintf_s(Value,ValueLen,"%02X",(ulong)*(byte *)((long)Data + sVar4));
        sVar4 = sVar4 + 1;
      } while (Size != sVar4);
    }
    break;
  case 0x12:
    p = (uint)*Data;
    goto LAB_00124ec3;
  case 0x13:
    p = (uint)*Data;
LAB_00124ec3:
    uVar3 = 0;
LAB_00124ec5:
    IntToString(Value,ValueLen,p,uVar3);
    break;
  case 0x14:
  case 0x21:
  case 0x22:
    p = *Data;
    uVar3 = (ulong)((uVar5 & 0x1f000000) == 0x10000000);
    goto LAB_00124ec5;
  case 0x15:
    p_00 = *Data;
    uVar3 = (ulong)((uVar5 & 0x1f000000) == 0x10000000);
    goto LAB_001250bf;
  case 0x19:
    NodeToString(Value,ValueLen,*Data);
    if (*Data != 0) {
      if (*Value != '\0') {
        tcscat_s(Value,ValueLen,".");
      }
      sVar2 = strlen(Value);
      NodeParamName(*Data,*(dataid *)((long)Data + 8),Value + sVar2,ValueLen - sVar2);
    }
    break;
  case 0x23:
    GUIDToString(Value,ValueLen,(cc_guid *)Data);
    break;
  case 0x24:
    local_40.Num = (int_fast32_t)*Data;
    Data = &local_40;
    local_40.Den = 0x10000;
    Percent = 0;
    Decimal = 3;
LAB_00125058:
    FractionToString(Value,ValueLen,(cc_fraction *)Data,Percent,Decimal);
    break;
  case 0x29:
    p_00 = *Data;
    uVar3 = 0;
LAB_001250bf:
    Int64ToString(Value,ValueLen,p_00,uVar3);
  }
  return 1;
}

Assistant:

NOINLINE bool_t DataToString(tchar_t* Value, size_t ValueLen, const void* Data, size_t Size, dataflags Type)
{
    cc_fraction f;
    size_t i;

    if (!Size)
        Size = NodeTypeSize(Type);

    if (Type & TFLAG_DEFAULT)
    {
        if ((Type & TYPE_MASK) == TYPE_STRING)
        {
            if (((const tchar_t*)Data)[0]==0)
                return 0;
        }
        else
        {
            for (i=0;i<Size;++i)
                if (((const uint8_t*)Data)[i])
                    break;
            if (i==Size)
                return 0;
        }
    }

    Value[0] = 0;

    switch (Type & TYPE_MASK)
    {
    case TYPE_BINARY:
           for (i=0;i<Size;++i)
            stcatprintf_s(Value,ValueLen,T("%02X"),((uint8_t*)Data)[i]);
        break;

    case TYPE_RGB:
        RGBToString(Value,ValueLen,*(rgbval_t*)Data);
        break;

    case TYPE_SIZE:
#if SIZE_MAX > INT32_MAX
        Int64ToString(Value,ValueLen,*(size_t*)Data,0);
#else
        IntToString(Value,ValueLen,*(size_t*)Data,0);
#endif
        break;

    case TYPE_INT:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
        {
            f.Num = *(int*)Data;
            f.Den = PERCENT_ONE;
            FractionToString(Value,ValueLen,&f,-1,1);
        }
        else
        {
            IntToString(Value,ValueLen,*(int*)Data,0);
        }
        break;

    case TYPE_INT8:
        IntToString(Value,ValueLen,*(uint8_t*)Data,0);
        break;

    case TYPE_INT16:
        IntToString(Value,ValueLen,*(int16_t*)Data,0);
        break;

    case TYPE_GUID:
        GUIDToString(Value,ValueLen,(const cc_guid*)Data);
        break;

    case TYPE_DBNO: //TODO: support for 64 bits
    case TYPE_DATETIME:
    case TYPE_INT32:
        IntToString(Value,ValueLen,*(int32_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_INT64:
        Int64ToString(Value,ValueLen,*(int64_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_BOOL_BIT:
    case TYPE_BOOLEAN:
        IntToString(Value,ValueLen,(int32_t)*(bool_t*)Data,0);
        break;

    case TYPE_FOURCC:
        FourCCToString(Value,ValueLen,*(fourcc_t*)Data);
        break;

    case TYPE_POINT:
        stprintf_s(Value,ValueLen,T("%d,%d"),((cc_point*)Data)->x,((cc_point*)Data)->y);
        break;

    case TYPE_RECT:
        stprintf_s(Value,ValueLen,T("%d,%d,%d,%d"),((cc_rect*)Data)->x,((cc_rect*)Data)->y,((cc_rect*)Data)->Width,((cc_rect*)Data)->Height);
        break;

    case TYPE_FIX16:
        f.Num = *(int*)Data;
        f.Den = FIX16_UNIT;
        FractionToString(Value,ValueLen,&f,0,3);
        break;

    case TYPE_FRACTION:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
            FractionToString(Value,ValueLen,(cc_fraction*)Data,-1,2);
        else
            stprintf_s(Value,ValueLen,T("%d:%d"),((cc_fraction*)Data)->Num,((cc_fraction*)Data)->Den);
        break;

    case TYPE_PIN:
        PinToString(Value,ValueLen,(pin*)Data);
        break;

    case TYPE_NODE:
        NodeToString(Value,ValueLen,*(node**)Data);
        break;

    case TYPE_STRING:
        tcscpy_s(Value,ValueLen,(tchar_t*)Data);
        break;
    }

    return 1;
}